

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byte_string.hpp
# Opt level: O0

type_conflict2
jsoncons::detail::encode_base64_generic<unsigned_char_const*,std::__cxx11::string>
          (uchar *first,uchar *last,char *alphabet,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *result)

{
  char cVar1;
  undefined8 in_RCX;
  undefined1 *puVar2;
  int iVar3;
  long in_RDX;
  undefined1 *in_RSI;
  undefined1 *in_RDI;
  int j;
  int i;
  uchar fill;
  uchar a4 [4];
  uchar a3 [3];
  size_t count;
  int local_38;
  int local_34;
  undefined1 local_2b [3];
  type_conflict2 local_28;
  undefined8 local_20;
  undefined1 *local_10;
  undefined1 *local_8;
  
  local_28 = 0;
  cVar1 = *(char *)(in_RDX + 0x40);
  local_34 = 0;
  local_20 = in_RCX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  while (local_8 != local_10) {
    puVar2 = local_8 + 1;
    iVar3 = local_34 + 1;
    local_2b[local_34] = *local_8;
    local_34 = iVar3;
    local_8 = puVar2;
    if (iVar3 == 3) {
      for (local_34 = 0; local_34 < 4; local_34 = local_34 + 1) {
        std::__cxx11::string::push_back((char)local_20);
        local_28 = local_28 + 1;
      }
      local_34 = 0;
    }
  }
  if (0 < local_34) {
    for (local_38 = local_34; local_38 < 3; local_38 = local_38 + 1) {
      local_2b[local_38] = 0;
    }
    for (local_38 = 0; local_38 < local_34 + 1; local_38 = local_38 + 1) {
      std::__cxx11::string::push_back((char)local_20);
      local_28 = local_28 + 1;
    }
    if (cVar1 != '\0') {
      while (local_34 < 3) {
        std::__cxx11::string::push_back((char)local_20);
        local_28 = local_28 + 1;
        local_34 = local_34 + 1;
      }
    }
  }
  return local_28;
}

Assistant:

typename std::enable_if<std::is_same<typename std::iterator_traits<InputIt>::value_type,uint8_t>::value,size_t>::type
    encode_base64_generic(InputIt first, InputIt last, const char alphabet[65], Container& result)
    {
        std::size_t count = 0;
        unsigned char a3[3];
        unsigned char a4[4];
        unsigned char fill = alphabet[64];
        int i = 0;
        int j = 0;

        while (first != last)
        {
            a3[i++] = *first++;
            if (i == 3)
            {
                a4[0] = (a3[0] & 0xfc) >> 2;
                a4[1] = ((a3[0] & 0x03) << 4) + ((a3[1] & 0xf0) >> 4);
                a4[2] = ((a3[1] & 0x0f) << 2) + ((a3[2] & 0xc0) >> 6);
                a4[3] = a3[2] & 0x3f;

                for (i = 0; i < 4; i++) 
                {
                    result.push_back(alphabet[a4[i]]);
                    ++count;
                }
                i = 0;
            }
        }

        if (i > 0)
        {
            for (j = i; j < 3; ++j) 
            {
                a3[j] = 0;
            }

            a4[0] = (a3[0] & 0xfc) >> 2;
            a4[1] = ((a3[0] & 0x03) << 4) + ((a3[1] & 0xf0) >> 4);
            a4[2] = ((a3[1] & 0x0f) << 2) + ((a3[2] & 0xc0) >> 6);

            for (j = 0; j < i + 1; ++j) 
            {
                result.push_back(alphabet[a4[j]]);
                ++count;
            }

            if (fill != 0)
            {
                while (i++ < 3) 
                {
                    result.push_back(fill);
                    ++count;
                }
            }
        }

        return count;
    }